

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio_newc.c
# Opt level: O2

int write_header(archive_write *a,archive_entry *entry)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  ulong uVar4;
  wchar_t wVar5;
  uint uVar6;
  mode_t mVar7;
  int iVar8;
  archive_string_conv *sc;
  int *piVar9;
  char *pcVar10;
  dev_t dVar11;
  la_int64_t lVar12;
  void *__ptr;
  time_t tVar13;
  size_t sVar14;
  ulong uVar15;
  char *pcVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  int local_7c;
  size_t len;
  char *p;
  undefined2 local_62;
  undefined2 local_60;
  undefined2 local_5e;
  undefined2 local_5c;
  undefined2 local_5a;
  undefined2 local_58;
  undefined2 local_56;
  undefined2 local_54;
  uint local_52;
  undefined2 local_4e;
  uint local_4c;
  ulong local_48;
  long local_40;
  char *path;
  
  plVar3 = (long *)a->format_data;
  sc = get_sconv(a);
  wVar5 = _archive_entry_pathname_l(entry,&path,&len,sc);
  uVar20 = 0;
  local_7c = 0;
  if (wVar5 == L'\0') {
LAB_00145192:
    local_48 = (ulong)(uint)len;
    local_62 = 0x71c7;
    dVar11 = archive_entry_dev(entry);
    local_60 = (undefined2)dVar11;
    lVar12 = archive_entry_ino64(entry);
    if (lVar12 == 0) {
LAB_00145284:
      local_5e = (undefined2)uVar20;
      mVar7 = archive_entry_mode(entry);
      local_5c = (undefined2)mVar7;
      uVar6 = mVar7 & 0xf000;
      if ((uVar6 == 0xc000) || (uVar6 == 0x1000)) {
        pcVar16 = "sockets and fifos cannot be represented in the binary cpio formats";
      }
      else if ((uVar6 == 0xa000) && ((a->archive).archive_format == 0x10007)) {
        pcVar16 = "symbolic links cannot be represented in the PWB cpio format";
      }
      else {
        iVar19 = (int)local_48 + 1;
        lVar12 = archive_entry_uid(entry);
        local_5a = (undefined2)lVar12;
        lVar12 = archive_entry_gid(entry);
        local_58 = (undefined2)lVar12;
        uVar6 = archive_entry_nlink(entry);
        local_56 = (undefined2)uVar6;
        mVar7 = archive_entry_filetype(entry);
        if ((mVar7 == 0x6000) || (mVar7 = archive_entry_filetype(entry), mVar7 == 0x2000)) {
          dVar11 = archive_entry_rdev(entry);
          local_54 = (undefined2)dVar11;
        }
        else {
          local_54 = 0;
        }
        tVar13 = archive_entry_mtime(entry);
        local_52 = (uint)tVar13 << 0x10 | (uint)tVar13 >> 0x10;
        local_4e = (undefined2)iVar19;
        mVar7 = archive_entry_filetype(entry);
        if (mVar7 != 0x8000) {
          archive_entry_set_size(entry,0);
        }
        wVar5 = _archive_entry_symlink_l(entry,&p,&len,sc);
        if (wVar5 != L'\0') {
          piVar9 = __errno_location();
          if (*piVar9 == 0xc) {
            pcVar16 = "Can\'t allocate memory for Linkname";
            goto LAB_001452bb;
          }
          pcVar16 = archive_entry_symlink(entry);
          pcVar10 = archive_string_conversion_charset_name(sc);
          archive_set_error(&a->archive,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar16,
                            pcVar10);
          local_7c = -0x14;
        }
        if ((p == (char *)0x0 || CONCAT44(len._4_4_,(uint)len) == 0) || (*p == '\0')) {
          if (((a->archive).archive_format == 0x10007) &&
             (lVar12 = archive_entry_size(entry), 0xffffff < lVar12)) {
            pcVar16 = "File is too large for PWB binary cpio format.";
          }
          else {
            lVar12 = archive_entry_size(entry);
            if (lVar12 < 0x80000000) {
              lVar12 = archive_entry_size(entry);
              uVar6 = (uint)lVar12;
              goto LAB_00145483;
            }
            pcVar16 = "File is too large for binary cpio format.";
          }
          archive_set_error(&a->archive,0x22,pcVar16);
          iVar18 = -0x19;
          goto LAB_001452cb;
        }
        if ((a->archive).archive_format != 0x10007) {
          sVar14 = strlen(p);
          uVar6 = (uint)sVar14;
LAB_00145483:
          local_4c = uVar6 << 0x10 | uVar6 >> 0x10;
          iVar8 = __archive_write_output(a,&local_62,0x1a);
          iVar18 = -0x1e;
          if (((iVar8 == 0) && (iVar19 = __archive_write_output(a,path,(long)iVar19), iVar19 == 0))
             && (((local_48 & 1) != 0 || (iVar19 = __archive_write_nulls(a,1), iVar19 == 0)))) {
            lVar12 = archive_entry_size(entry);
            pcVar16 = p;
            *plVar3 = (ulong)((uint)lVar12 & 1) + lVar12;
            if ((p != (char *)0x0) && (*p != '\0')) {
              sVar14 = strlen(p);
              iVar19 = __archive_write_output(a,pcVar16,sVar14);
              if ((iVar19 != 0) ||
                 ((sVar14 = strlen(p), (sVar14 & 1) != 0 &&
                  (iVar19 = __archive_write_nulls(a,1), iVar19 != 0)))) goto LAB_001452cb;
            }
            iVar18 = local_7c;
          }
          goto LAB_001452cb;
        }
        pcVar16 = "symlinks are not supported by UNIX V6 or by PWB cpio";
      }
      iVar19 = 0x16;
    }
    else {
      uVar6 = archive_entry_nlink(entry);
      if (uVar6 < 2) {
        uVar20 = plVar3[1] + 1;
        plVar3[1] = uVar20;
      }
      else {
        uVar15 = plVar3[4];
        uVar20 = 0xffffffffffffffff;
        lVar17 = 0;
        do {
          uVar20 = uVar20 + 1;
          if (uVar15 == uVar20) {
            __ptr = (void *)plVar3[2];
            uVar20 = plVar3[1] + 1;
            plVar3[1] = uVar20;
            uVar4 = plVar3[3];
            if (uVar4 <= uVar15) {
              local_40 = uVar4 * 2;
              if (uVar4 < 0x200) {
                local_40 = 0x200;
              }
              __ptr = realloc(__ptr,local_40 << 4);
              if (__ptr == (void *)0x0) goto LAB_001452b4;
              plVar3[3] = local_40;
              plVar3[2] = (long)__ptr;
              uVar15 = plVar3[4];
            }
            *(la_int64_t *)((long)__ptr + uVar15 * 0x10) = lVar12;
            *(int *)((long)__ptr + uVar15 * 0x10 + 8) = (int)uVar20;
            plVar3[4] = uVar15 + 1;
            goto LAB_0014526d;
          }
          lVar1 = lVar17 + 0x10;
          plVar2 = (long *)(plVar3[2] + lVar17);
          lVar17 = lVar1;
        } while (*plVar2 != lVar12);
        uVar20 = (ulong)*(uint *)(plVar3[2] + -8 + lVar1);
      }
LAB_0014526d:
      if ((int)(uint)uVar20 < 0) {
LAB_001452b4:
        pcVar16 = "No memory for ino translation table";
        goto LAB_001452bb;
      }
      if ((uint)uVar20 < 0x8000) goto LAB_00145284;
      pcVar16 = "Too many files for this cpio format";
      iVar19 = 0x22;
    }
  }
  else {
    piVar9 = __errno_location();
    if (*piVar9 != 0xc) {
      local_7c = -0x14;
      pcVar16 = archive_entry_pathname(entry);
      pcVar10 = archive_string_conversion_charset_name(sc);
      archive_set_error(&a->archive,0x54,"Can\'t translate pathname \'%s\' to %s",pcVar16,pcVar10);
      goto LAB_00145192;
    }
    pcVar16 = "Can\'t allocate memory for Pathname";
LAB_001452bb:
    iVar19 = 0xc;
  }
  archive_set_error(&a->archive,iVar19,pcVar16);
  iVar18 = -0x1e;
LAB_001452cb:
  archive_entry_free((archive_entry *)0x0);
  return iVar18;
}

Assistant:

static int
write_header(struct archive_write *a, struct archive_entry *entry)
{
	int64_t ino;
	struct cpio *cpio;
	const char *p, *path;
	int pathlength, ret, ret_final;
	char h[c_header_size];
	struct archive_string_conv *sconv;
	struct archive_entry *entry_main;
	size_t len;
	int pad;

	cpio = (struct cpio *)a->format_data;
	ret_final = ARCHIVE_OK;
	sconv = get_sconv(a);

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Make sure the path separators in pathname, hardlink and symlink
	 * are all slash '/', not the Windows path separator '\'. */
	entry_main = __la_win_entry_in_posix_pathseparator(entry);
	if (entry_main == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate ustar data");
		return(ARCHIVE_FATAL);
	}
	if (entry != entry_main)
		entry = entry_main;
	else
		entry_main = NULL;
#else
	entry_main = NULL;
#endif

	ret = archive_entry_pathname_l(entry, &path, &len, sconv);
	if (ret != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate pathname '%s' to %s",
		    archive_entry_pathname(entry),
		    archive_string_conversion_charset_name(sconv));
		ret_final = ARCHIVE_WARN;
	}
	pathlength = (int)len + 1; /* Include trailing null. */

	memset(h, 0, c_header_size);
	format_hex(0x070701, h + c_magic_offset, c_magic_size);
	format_hex(archive_entry_devmajor(entry), h + c_devmajor_offset,
	    c_devmajor_size);
	format_hex(archive_entry_devminor(entry), h + c_devminor_offset,
	    c_devminor_size);

	ino = archive_entry_ino64(entry);
	if (ino > 0xffffffff) {
		archive_set_error(&a->archive, ERANGE,
		    "large inode number truncated");
		ret_final = ARCHIVE_WARN;
	}

	/* TODO: Set ret_final to ARCHIVE_WARN if any of these overflow. */
	format_hex(ino & 0xffffffff, h + c_ino_offset, c_ino_size);
	format_hex(archive_entry_mode(entry), h + c_mode_offset, c_mode_size);
	format_hex(archive_entry_uid(entry), h + c_uid_offset, c_uid_size);
	format_hex(archive_entry_gid(entry), h + c_gid_offset, c_gid_size);
	format_hex(archive_entry_nlink(entry), h + c_nlink_offset, c_nlink_size);
	if (archive_entry_filetype(entry) == AE_IFBLK
	    || archive_entry_filetype(entry) == AE_IFCHR) {
	    format_hex(archive_entry_rdevmajor(entry), h + c_rdevmajor_offset, c_rdevmajor_size);
	    format_hex(archive_entry_rdevminor(entry), h + c_rdevminor_offset, c_rdevminor_size);
	} else {
	    format_hex(0, h + c_rdevmajor_offset, c_rdevmajor_size);
	    format_hex(0, h + c_rdevminor_offset, c_rdevminor_size);
	}
	format_hex(archive_entry_mtime(entry), h + c_mtime_offset, c_mtime_size);
	format_hex(pathlength, h + c_namesize_offset, c_namesize_size);
	format_hex(0, h + c_checksum_offset, c_checksum_size);

	/* Non-regular files don't store bodies. */
	if (archive_entry_filetype(entry) != AE_IFREG)
		archive_entry_set_size(entry, 0);

	/* Symlinks get the link written as the body of the entry. */
	ret = archive_entry_symlink_l(entry, &p, &len, sconv);
	if (ret != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Likname");
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate linkname '%s' to %s",
		    archive_entry_symlink(entry),
		    archive_string_conversion_charset_name(sconv));
		ret_final = ARCHIVE_WARN;
	}
	if (len > 0 && p != NULL  &&  *p != '\0')
		ret = format_hex(strlen(p), h + c_filesize_offset,
		    c_filesize_size);
	else
		ret = format_hex(archive_entry_size(entry),
		    h + c_filesize_offset, c_filesize_size);
	if (ret) {
		archive_set_error(&a->archive, ERANGE,
		    "File is too large for this format.");
		ret_final = ARCHIVE_FAILED;
		goto exit_write_header;
	}

	ret = __archive_write_output(a, h, c_header_size);
	if (ret != ARCHIVE_OK) {
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	}

	/* Pad pathname to even length. */
	ret = __archive_write_output(a, path, pathlength);
	if (ret != ARCHIVE_OK) {
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	}
	pad = PAD4(pathlength + c_header_size);
	if (pad) {
		ret = __archive_write_output(a, "\0\0\0", pad);
		if (ret != ARCHIVE_OK) {
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
	}

	cpio->entry_bytes_remaining = archive_entry_size(entry);
	cpio->padding = (int)PAD4(cpio->entry_bytes_remaining);

	/* Write the symlink now. */
	if (p != NULL  &&  *p != '\0') {
		ret = __archive_write_output(a, p, strlen(p));
		if (ret != ARCHIVE_OK) {
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		pad = PAD4(strlen(p));
		ret = __archive_write_output(a, "\0\0\0", pad);
		if (ret != ARCHIVE_OK) {
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
	}
exit_write_header:
	archive_entry_free(entry_main);
	return (ret_final);
}